

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O3

bool __thiscall
QWidgetTextControlPrivate::cursorMoveKeyEvent(QWidgetTextControlPrivate *this,QKeyEvent *e)

{
  QTextCursor *cursor;
  QObject *pQVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  StandardKey SVar5;
  bool bVar6;
  bool forceEmitSelectionChanged;
  MoveMode MVar7;
  long in_FS_OFFSET;
  QTextLine QVar8;
  QTextCursor oldSelection;
  undefined1 *local_60 [3];
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = *(QObject **)&this->field_0x8;
  cursor = &this->cursor;
  cVar2 = QTextCursor::isNull();
  if (cVar2 != '\0') {
    bVar6 = false;
    goto LAB_004bc9f9;
  }
  local_60[0] = &DAT_aaaaaaaaaaaaaaaa;
  QTextCursor::QTextCursor((QTextCursor *)local_60,cursor);
  iVar3 = QTextCursor::position();
  bVar6 = false;
  forceEmitSelectionChanged = false;
  if (e != (QKeyEvent *)0x0) {
    SVar5 = (StandardKey)e;
    cVar2 = QKeyEvent::matches(SVar5);
    if (cVar2 != '\0') {
      iVar4 = 0;
      MVar7 = 0x13;
      goto LAB_004bc948;
    }
    cVar2 = QKeyEvent::matches(SVar5);
    if (cVar2 != '\0') {
      MVar7 = 9;
      goto LAB_004bc82f;
    }
    cVar2 = QKeyEvent::matches(SVar5);
    forceEmitSelectionChanged = true;
    if (cVar2 == '\0') {
      cVar2 = QKeyEvent::matches(SVar5);
      if (cVar2 != '\0') {
        MVar7 = 9;
        goto LAB_004bc942;
      }
      cVar2 = QKeyEvent::matches(SVar5);
      if (cVar2 != '\0') {
        MVar7 = 0x14;
        goto LAB_004bc942;
      }
      cVar2 = QKeyEvent::matches(SVar5);
      if (cVar2 != '\0') {
        MVar7 = 10;
        goto LAB_004bc942;
      }
      cVar2 = QKeyEvent::matches(SVar5);
      if (cVar2 != '\0') {
        MVar7 = 3;
        goto LAB_004bc942;
      }
      cVar2 = QKeyEvent::matches(SVar5);
      if (cVar2 != '\0') {
        MVar7 = 0xd;
        goto LAB_004bc942;
      }
      cVar2 = QKeyEvent::matches(SVar5);
      if (cVar2 != '\0') {
        MVar7 = 4;
        goto LAB_004bc942;
      }
      cVar2 = QKeyEvent::matches(SVar5);
      if (cVar2 != '\0') {
        MVar7 = 0xf;
        goto LAB_004bc942;
      }
      cVar2 = QKeyEvent::matches(SVar5);
      if (cVar2 != '\0') {
        MVar7 = KeepAnchor;
        goto LAB_004bc942;
      }
      cVar2 = QKeyEvent::matches(SVar5);
      if (cVar2 != '\0') {
        MVar7 = 0xb;
        goto LAB_004bc942;
      }
      cVar2 = QKeyEvent::matches(SVar5);
      if (cVar2 != '\0') {
        local_48 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
        QTextCursor::block();
        QVar8 = currentTextLine(cursor);
        QTextBlock::previous();
        cVar2 = QTextBlock::isValid();
        if (QVar8.eng == (QTextEngine *)0x0 || cVar2 != '\0') {
          MVar7 = 2;
        }
        else {
          MVar7 = 2 - (QVar8.index == 0);
        }
        goto LAB_004bc942;
      }
      cVar2 = QKeyEvent::matches(SVar5);
      if (cVar2 != '\0') {
        local_48 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
        QTextCursor::block();
        QVar8 = currentTextLine(cursor);
        QTextBlock::next();
        cVar2 = QTextBlock::isValid();
        if (QVar8.eng == (QTextEngine *)0x0 || cVar2 != '\0') {
          MVar7 = 0xc;
        }
        else {
          QTextBlock::layout();
          iVar4 = QTextLayout::lineCount();
          MVar7 = (QVar8.index != iVar4 + -1) + 0xb;
        }
        goto LAB_004bc942;
      }
      cVar2 = QKeyEvent::matches(SVar5);
      forceEmitSelectionChanged = false;
      iVar4 = 0;
      MVar7 = 0x14;
      if (cVar2 == '\0') {
        cVar2 = QKeyEvent::matches(SVar5);
        forceEmitSelectionChanged = false;
        MVar7 = 10;
        iVar4 = 0;
        if (cVar2 == '\0') {
          cVar2 = QKeyEvent::matches(SVar5);
          forceEmitSelectionChanged = false;
          MVar7 = 0xf;
          iVar4 = 0;
          if (cVar2 == '\0') {
            cVar2 = QKeyEvent::matches(SVar5);
            forceEmitSelectionChanged = false;
            MVar7 = 4;
            iVar4 = 0;
            if (cVar2 == '\0') {
              cVar2 = QKeyEvent::matches(SVar5);
              if (cVar2 == '\0') {
                cVar2 = QKeyEvent::matches(SVar5);
                if (cVar2 == '\0') {
                  cVar2 = QKeyEvent::matches(SVar5);
                  forceEmitSelectionChanged = false;
                  MVar7 = 3;
                  iVar4 = 0;
                  if (cVar2 == '\0') {
                    cVar2 = QKeyEvent::matches(SVar5);
                    forceEmitSelectionChanged = false;
                    MVar7 = 0xd;
                    iVar4 = 0;
                    if (cVar2 == '\0') {
                      cVar2 = QKeyEvent::matches(SVar5);
                      forceEmitSelectionChanged = false;
                      MVar7 = KeepAnchor;
                      iVar4 = 0;
                      if (cVar2 == '\0') {
                        cVar2 = QKeyEvent::matches(SVar5);
                        bVar6 = false;
                        forceEmitSelectionChanged = false;
                        MVar7 = 0xb;
                        iVar4 = 0;
                        if (cVar2 == '\0') goto LAB_004bc9ef;
                      }
                    }
                  }
                  goto LAB_004bc948;
                }
                MVar7 = 2;
              }
              else {
                MVar7 = 0xc;
              }
LAB_004bc82f:
              forceEmitSelectionChanged = false;
              iVar4 = 0;
            }
          }
        }
      }
    }
    else {
      MVar7 = 0x13;
LAB_004bc942:
      iVar4 = 1;
    }
LAB_004bc948:
    QTextCursor::visualNavigation();
    QTextCursor::setVisualNavigation(SUB81(cursor,0));
    cVar2 = QTextCursor::movePosition((MoveOperation)cursor,MVar7,iVar4);
    QTextCursor::setVisualNavigation(SUB81(cursor,0));
    (**(code **)(*(long *)pQVar1 + 0x60))(pQVar1);
    if (cVar2 == '\0') {
      if ((*(int *)(e + 0x40) + 0xfeffffeeU < 4) && (this->ignoreUnusedNavigationEvents != false)) {
        iVar3 = QTextCursor::anchor();
        iVar4 = QTextCursor::anchor();
        if (iVar3 == iVar4) {
          bVar6 = false;
          goto LAB_004bc9ef;
        }
      }
    }
    else {
      iVar4 = QTextCursor::position();
      if (iVar4 != iVar3) {
        QMetaObject::activate(pQVar1,&QWidgetTextControl::staticMetaObject,6,(void **)0x0);
      }
      QMetaObject::activate(pQVar1,&QWidgetTextControl::staticMetaObject,0xc,(void **)0x0);
    }
    selectionChanged(this,forceEmitSelectionChanged);
    repaintOldAndNewSelection(this,(QTextCursor *)local_60);
    bVar6 = true;
  }
LAB_004bc9ef:
  QTextCursor::~QTextCursor((QTextCursor *)local_60);
LAB_004bc9f9:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar6;
}

Assistant:

bool QWidgetTextControlPrivate::cursorMoveKeyEvent(QKeyEvent *e)
{
#ifdef QT_NO_SHORTCUT
    Q_UNUSED(e);
#endif

    Q_Q(QWidgetTextControl);
    if (cursor.isNull())
        return false;

    const QTextCursor oldSelection = cursor;
    const int oldCursorPos = cursor.position();

    QTextCursor::MoveMode mode = QTextCursor::MoveAnchor;
    QTextCursor::MoveOperation op = QTextCursor::NoMove;

    if (false) {
    }
#ifndef QT_NO_SHORTCUT
    if (e == QKeySequence::MoveToNextChar) {
            op = QTextCursor::Right;
    }
    else if (e == QKeySequence::MoveToPreviousChar) {
            op = QTextCursor::Left;
    }
    else if (e == QKeySequence::SelectNextChar) {
           op = QTextCursor::Right;
           mode = QTextCursor::KeepAnchor;
    }
    else if (e == QKeySequence::SelectPreviousChar) {
            op = QTextCursor::Left;
            mode = QTextCursor::KeepAnchor;
    }
    else if (e == QKeySequence::SelectNextWord) {
            op = QTextCursor::WordRight;
            mode = QTextCursor::KeepAnchor;
    }
    else if (e == QKeySequence::SelectPreviousWord) {
            op = QTextCursor::WordLeft;
            mode = QTextCursor::KeepAnchor;
    }
    else if (e == QKeySequence::SelectStartOfLine) {
            op = QTextCursor::StartOfLine;
            mode = QTextCursor::KeepAnchor;
    }
    else if (e == QKeySequence::SelectEndOfLine) {
            op = QTextCursor::EndOfLine;
            mode = QTextCursor::KeepAnchor;
    }
    else if (e == QKeySequence::SelectStartOfBlock) {
            op = QTextCursor::StartOfBlock;
            mode = QTextCursor::KeepAnchor;
    }
    else if (e == QKeySequence::SelectEndOfBlock) {
            op = QTextCursor::EndOfBlock;
            mode = QTextCursor::KeepAnchor;
    }
    else if (e == QKeySequence::SelectStartOfDocument) {
            op = QTextCursor::Start;
            mode = QTextCursor::KeepAnchor;
    }
    else if (e == QKeySequence::SelectEndOfDocument) {
            op = QTextCursor::End;
            mode = QTextCursor::KeepAnchor;
    }
    else if (e == QKeySequence::SelectPreviousLine) {
            op = QTextCursor::Up;
            mode = QTextCursor::KeepAnchor;
            {
                QTextBlock block = cursor.block();
                QTextLine line = currentTextLine(cursor);
                if (!block.previous().isValid()
                    && line.isValid()
                    && line.lineNumber() == 0)
                    op = QTextCursor::Start;
            }
    }
    else if (e == QKeySequence::SelectNextLine) {
            op = QTextCursor::Down;
            mode = QTextCursor::KeepAnchor;
            {
                QTextBlock block = cursor.block();
                QTextLine line = currentTextLine(cursor);
                if (!block.next().isValid()
                    && line.isValid()
                    && line.lineNumber() == block.layout()->lineCount() - 1)
                    op = QTextCursor::End;
            }
    }
    else if (e == QKeySequence::MoveToNextWord) {
            op = QTextCursor::WordRight;
    }
    else if (e == QKeySequence::MoveToPreviousWord) {
            op = QTextCursor::WordLeft;
    }
    else if (e == QKeySequence::MoveToEndOfBlock) {
            op = QTextCursor::EndOfBlock;
    }
    else if (e == QKeySequence::MoveToStartOfBlock) {
            op = QTextCursor::StartOfBlock;
    }
    else if (e == QKeySequence::MoveToNextLine) {
            op = QTextCursor::Down;
    }
    else if (e == QKeySequence::MoveToPreviousLine) {
            op = QTextCursor::Up;
    }
    else if (e == QKeySequence::MoveToStartOfLine) {
            op = QTextCursor::StartOfLine;
    }
    else if (e == QKeySequence::MoveToEndOfLine) {
            op = QTextCursor::EndOfLine;
    }
    else if (e == QKeySequence::MoveToStartOfDocument) {
            op = QTextCursor::Start;
    }
    else if (e == QKeySequence::MoveToEndOfDocument) {
            op = QTextCursor::End;
    }
#endif // QT_NO_SHORTCUT
    else {
        return false;
    }

// Except for pageup and pagedown, OS X has very different behavior, we don't do it all, but
// here's the breakdown:
// Shift still works as an anchor, but only one of the other keys can be down Ctrl (Command),
// Alt (Option), or Meta (Control).
// Command/Control + Left/Right -- Move to left or right of the line
//                 + Up/Down -- Move to top bottom of the file. (Control doesn't move the cursor)
// Option + Left/Right -- Move one word Left/right.
//        + Up/Down  -- Begin/End of Paragraph.
// Home/End Top/Bottom of file. (usually don't move the cursor, but will select)

    bool visualNavigation = cursor.visualNavigation();
    cursor.setVisualNavigation(true);
    const bool moved = cursor.movePosition(op, mode);
    cursor.setVisualNavigation(visualNavigation);
    q->ensureCursorVisible();

    bool ignoreNavigationEvents = ignoreUnusedNavigationEvents;
    bool isNavigationEvent = e->key() == Qt::Key_Up || e->key() == Qt::Key_Down;

#ifdef QT_KEYPAD_NAVIGATION
    ignoreNavigationEvents = ignoreNavigationEvents || QApplicationPrivate::keypadNavigationEnabled();
    isNavigationEvent = isNavigationEvent ||
                        (QApplication::navigationMode() == Qt::NavigationModeKeypadDirectional
                         && (e->key() == Qt::Key_Left || e->key() == Qt::Key_Right));
#else
    isNavigationEvent = isNavigationEvent || e->key() == Qt::Key_Left || e->key() == Qt::Key_Right;
#endif

    if (moved) {
        if (cursor.position() != oldCursorPos)
            emit q->cursorPositionChanged();
        emit q->microFocusChanged();
    } else if (ignoreNavigationEvents && isNavigationEvent && oldSelection.anchor() == cursor.anchor()) {
        return false;
    }

    selectionChanged(/*forceEmitSelectionChanged =*/(mode == QTextCursor::KeepAnchor));

    repaintOldAndNewSelection(oldSelection);

    return true;
}